

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jurassic-jigsaw.cpp
# Opt level: O2

tiles_t * read_tiles(tiles_t *__return_storage_ptr__,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *tokens)

{
  bool bVar1;
  mapped_type *this;
  invalid_argument *this_00;
  int iVar2;
  pointer this_01;
  basic_string_view<char,_std::char_traits<char>_> __x;
  generic_tile_t<10UL> local_2f0;
  generic_tile_t<10UL> local_190;
  
  *(undefined8 *)&(__return_storage_ptr__->_M_h)._M_rehash_policy = 0;
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  this_01 = (tokens->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  iVar2 = 0;
  memset(&local_2f0,0,0x15c);
  for (; this_01 !=
         (tokens->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish; this_01 = this_01 + 1) {
    if (this_01->_M_string_length == 0) {
      if (iVar2 == 10) {
        generic_tile_t<10UL>::make_edges((edges_t *)&local_190,&local_2f0);
        memcpy(&local_2f0.edges,&local_190,0x50);
        generic_tile_t<10UL>::make_corners((corners_t *)&local_190,&local_2f0);
        std::array<std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>,_8UL>::operator=
                  (&local_2f0.corners,
                   (array<std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>,_8UL> *)
                   &local_190);
        this = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_generic_tile_t<10UL>_>,_std::allocator<std::pair<const_unsigned_long,_generic_tile_t<10UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_generic_tile_t<10UL>_>,_std::allocator<std::pair<const_unsigned_long,_generic_tile_t<10UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)__return_storage_ptr__,&local_2f0.id);
        generic_tile_t<10UL>::operator=(this,&local_2f0);
      }
      iVar2 = 0;
      memset(&local_190,0,0x15c);
      generic_tile_t<10UL>::operator=(&local_2f0,&local_190);
    }
    else {
      __x._M_str = "Tile ";
      __x._M_len = 5;
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              starts_with(this_01,__x);
      if (bVar1) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_190,
                   this_01,5,this_01->_M_string_length - 6);
        local_2f0.id = std::__cxx11::stoull((string *)&local_190,(size_t *)0x0,10);
        std::__cxx11::string::~string((string *)&local_190);
      }
      else {
        std::ranges::__copy_fn::
        operator()<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char_*>
                  ((__copy_fn *)&std::ranges::copy,this_01,local_2f0.data._M_elems[iVar2]._M_elems);
        iVar2 = iVar2 + 1;
      }
    }
  }
  if (iVar2 == 0) {
    return __return_storage_ptr__;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (this_00,"Unprocessed data, did you end with an empty line?");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

tiles_t read_tiles(const std::vector<std::string>& tokens) {
  auto tiles = tiles_t {};

  auto it = tokens.cbegin();
  auto tile = tile_t {};
  static constexpr auto id_prefix = std::string_view {"Tile "};
  auto row = 0;
  while (it != tokens.cend()) {
    if (it->empty()) { // make sure to end with an empty line
      if (row == 10) {
        tile.edges = tile.make_edges();
        tile.corners = tile.make_corners();
        tiles[tile.id] = tile;
      }
      row = 0;
      tile = {};
    } else if (it->starts_with(id_prefix)) {
      tile.id = std::stoull(it->substr(id_prefix.size(), it->size() - id_prefix.size()-1));
    } else {
      ranges::copy(*it, tile.data[row++].begin());
    }

    it++;
  }
  if (row != 0) {
    throw std::invalid_argument("Unprocessed data, did you end with an empty line?");
  }

  return tiles;
}